

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_cl_parser.cxx
# Opt level: O1

bool __thiscall cl_parser::parse(cl_parser *this,int argc,char **argv,int optc,option_desc *optv)

{
  option_type oVar1;
  char *__s1;
  bool bVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  int iVar6;
  option *poVar7;
  bool bVar8;
  long lVar9;
  size_t sVar10;
  option_desc *poVar11;
  char **ppcVar12;
  ulong uVar13;
  int iVar14;
  char *__s2;
  double dVar15;
  size_t local_68;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)argc;
  uVar13 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x18),8) == 0) {
    uVar13 = SUB168(auVar3 * ZEXT816(0x18),0);
  }
  poVar7 = (option *)operator_new__(uVar13);
  this->m_options = poVar7;
  this->m_argc = (ulong)(argc & 0x7fffffff);
  bVar8 = argc < 2;
  if (argc < 2) {
    local_68 = 0;
  }
  else {
    lVar9 = (ulong)(argc & 0x7fffffff) - 1;
    local_68 = 0;
    do {
      ppcVar12 = argv + 1;
      __s1 = argv[1];
      if (*__s1 == '-') {
        bVar4 = true;
        bVar2 = 0 < optc;
        if (0 < optc) {
          __s2 = optv->name;
          iVar5 = strcmp(__s1,__s2);
          poVar11 = optv;
          iVar6 = optc + 1;
          while (iVar5 != 0) {
            iVar14 = iVar6 + -1;
            bVar2 = 1 < iVar14;
            if (SBORROW4(iVar14,2) != iVar6 + -3 < 0) {
              bVar4 = true;
              goto LAB_0014f119;
            }
            __s2 = poVar11[1].name;
            poVar11 = poVar11 + 1;
            iVar5 = strcmp(__s1,__s2);
            iVar6 = iVar14;
          }
          sVar10 = local_68 + 1;
          poVar7 = this->m_options + local_68;
          poVar7->name = __s2;
          oVar1 = poVar11->type;
          poVar7->type = oVar1;
          local_68 = sVar10;
          if (oVar1 == OT_BOOL) {
            (poVar7->field_2).v_bool = true;
          }
          else {
            if (argc == 2) {
              argc = 1;
              bVar4 = false;
              goto LAB_0014f119;
            }
            argc = argc + -1;
            ppcVar12 = argv + 2;
            if (oVar1 == OT_INTEGER) {
              iVar6 = atoi(*ppcVar12);
              (poVar7->field_2).v_integer = iVar6;
            }
            else if (oVar1 == OT_FLOAT) {
              dVar15 = atof(*ppcVar12);
              (poVar7->field_2).v_float = (float)dVar15;
            }
            else {
              if (oVar1 != OT_STRING) {
                bVar4 = false;
                goto LAB_0014f119;
              }
              (poVar7->field_2).v_string = *ppcVar12;
            }
          }
          bVar4 = true;
        }
LAB_0014f119:
        if (!bVar2) {
          return bVar8;
        }
        iVar6 = argc;
        if (!bVar4) {
          return bVar8;
        }
      }
      else {
        this->m_options[lVar9].name = __s1;
        lVar9 = lVar9 + -1;
        this->m_num_params = this->m_num_params + 1;
        iVar6 = argc;
      }
      argc = iVar6 + -1;
      bVar8 = iVar6 < 3;
      argv = ppcVar12;
    } while (2 < iVar6);
  }
  this->m_num_options = local_68;
  return bVar8;
}

Assistant:

bool cl_parser::parse(int argc, const char* const argv[],
		int optc, const option_desc* optv)
{
	m_options = new option[argc];
	m_argc = size_t(argc & INT_MAX);

	size_t opt_idx = 0, param_idx = size_t(argc & INT_MAX) - 1;
	for (++argv; argc > 1; ++argv, --argc) {
		if ((*argv)[0] != '-') {
			m_options[param_idx].name = *argv;
			--param_idx;
			++m_num_params;
			continue;
		}
		bool valid = false;
		const option_desc* desc = optv;
		for (int j = optc; j > 0; --j, ++desc) {
			if (std::strcmp(*argv, desc->name) != 0)
				continue;
			valid = true;
			option& opt = m_options[opt_idx++];
			opt.name = desc->name;
			opt.type = desc->type;
			if (opt.type == OT_BOOL) {
				opt.v_bool = true;
			} else if (--argc <= 1) {
				return false;
			} else {
				++argv;
				switch (opt.type) {
				case OT_STRING:
					opt.v_string = *argv;
					break;
				case OT_INTEGER:
					opt.v_integer = std::atoi(*argv);
					break;
				case OT_FLOAT:
					opt.v_float = float(std::atof(*argv));
					break;
				default:
					return false;
				}
			}
			break;
		}
		if (!valid)
			return false;
	}
	m_num_options = opt_idx;
	return true;
}